

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

fxp_xfer * xfer_download_init(fxp_handle *fh,uint64_t offset)

{
  fxp_xfer *xfer;
  
  xfer = xfer_init(fh,offset);
  xfer->eof = false;
  xfer_download_queue(xfer);
  return xfer;
}

Assistant:

struct fxp_xfer *xfer_download_init(struct fxp_handle *fh, uint64_t offset)
{
    struct fxp_xfer *xfer = xfer_init(fh, offset);

    xfer->eof = false;
    xfer_download_queue(xfer);

    return xfer;
}